

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::integrate(Integrator *this)

{
  long *in_RDI;
  RealType RVar1;
  
  (**(code **)(*in_RDI + 0x10))();
  while( true ) {
    RVar1 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    if ((double)in_RDI[3] < RVar1) break;
    (**(code **)(*in_RDI + 0x18))();
    (**(code **)(*in_RDI + 0x20))();
    (**(code **)(*in_RDI + 0x30))();
  }
  (**(code **)(*in_RDI + 0x38))();
  return;
}

Assistant:

void Integrator::integrate() {
    initialize();

    while (snap->getTime() <= runTime) {
      preStep();
      step();
      postStep();
    }

    finalize();
  }